

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcalendarwidget.cpp
# Opt level: O2

Section __thiscall
QtPrivate::QCalendarYearValidator::handleKey(QCalendarYearValidator *this,int key)

{
  ulong uVar1;
  int extraout_EAX;
  int extraout_EAX_00;
  int iVar2;
  int iVar3;
  double in_XMM0_Qa;
  
  switch(key) {
  case 0x1000012:
  case 0x1000014:
    this->m_pos = 0;
    break;
  case 0x1000013:
    this->m_pos = 0;
    this->m_year = this->m_year + 1;
    break;
  case 0x1000015:
    this->m_pos = 0;
    this->m_year = this->m_year + -1;
    break;
  default:
    if ((key == 0x1000003) || (key == 0x1000061)) {
      iVar3 = 3;
      if (0 < this->m_pos) {
        iVar3 = this->m_pos + -1;
      }
      this->m_pos = iVar3;
      pow10(this,in_XMM0_Qa);
      uVar1 = (long)this->m_year % (long)(extraout_EAX * 10);
      this->m_year = (int)((long)((ulong)(uint)((int)uVar1 >> 0x1f) << 0x20 | uVar1 & 0xffffffff) /
                          10) + (this->m_oldYear - this->m_oldYear % extraout_EAX);
      return (iVar3 == 0) + ThisSection;
    }
    if (0xfffffff5 < key - 0x3aU) {
      iVar3 = this->m_pos;
      pow10(this,in_XMM0_Qa);
      iVar2 = this->m_year;
      this->m_year = (iVar2 % extraout_EAX_00) * 10 + (key - iVar2 % (extraout_EAX_00 * 10)) + iVar2
                     + -0x30;
      iVar2 = 0;
      if (iVar3 < 3) {
        iVar2 = iVar3 + 1;
      }
      this->m_pos = iVar2;
      return (uint)(iVar3 < 3);
    }
  }
  return ThisSection;
}

Assistant:

QCalendarDateSectionValidator::Section QCalendarYearValidator::handleKey(int key)
{
    if (key == Qt::Key_Right || key == Qt::Key_Left) {
        m_pos = 0;
        return QCalendarDateSectionValidator::ThisSection;
    } else if (key == Qt::Key_Up) {
        m_pos = 0;
        ++m_year;
        return QCalendarDateSectionValidator::ThisSection;
    } else if (key == Qt::Key_Down) {
        m_pos = 0;
        --m_year;
        return QCalendarDateSectionValidator::ThisSection;
    } else if (key == Qt::Key_Back || key == Qt::Key_Backspace) {
        --m_pos;
        if (m_pos < 0)
            m_pos = 3;

        int pow = pow10(m_pos);
        m_year = m_oldYear / pow * pow + m_year % (pow * 10) / 10;

        if (m_pos == 0)
            return QCalendarDateSectionValidator::PrevSection;
        return QCalendarDateSectionValidator::ThisSection;
    }
    if (key < Qt::Key_0 || key > Qt::Key_9)
        return QCalendarDateSectionValidator::ThisSection;
    int pressedKey = key - Qt::Key_0;
    int pow = pow10(m_pos);
    m_year = m_year / (pow * 10) * (pow * 10) + m_year % pow * 10 + pressedKey;
    ++m_pos;
    if (m_pos > 3) {
        m_pos = 0;
        return QCalendarDateSectionValidator::NextSection;
    }
    return QCalendarDateSectionValidator::ThisSection;
}